

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O1

void __thiscall
slang::analysis::AbstractFlowAnalysis<TestAnalysis,_int>::visitStmt
          (AbstractFlowAnalysis<TestAnalysis,_int> *this,PatternCaseStatement *stmt)

{
  pointer pIVar1;
  bool bVar2;
  size_t sVar3;
  Expression *this_00;
  Statement *this_01;
  int iVar4;
  int iVar5;
  ItemGroup *item;
  pointer pIVar6;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
            (stmt->expr,stmt->expr,(TestAnalysis *)this);
  iVar4 = this->state;
  sVar3 = (stmt->items)._M_extent._M_extent_value;
  if (sVar3 == 0) {
    iVar5 = 0;
  }
  else {
    pIVar6 = (stmt->items)._M_ptr;
    pIVar1 = pIVar6 + sVar3;
    iVar5 = 0;
    do {
      this->isStateSplit = false;
      this->state = iVar4;
      this->stateWhenTrue = 0;
      this->stateWhenFalse = 0;
      ast::Pattern::visit<TestAnalysis>((pIVar6->pattern).ptr,(TestAnalysis *)this);
      this_00 = pIVar6->filter;
      if (this_00 != (Expression *)0x0) {
        bVar2 = this->inCondition;
        this->inCondition = true;
        ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
                  (this_00,this_00,(TestAnalysis *)this);
        this->inCondition = bVar2;
        adjustConditionalState((ConstantValue *)&local_58,this,this_00);
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage(&local_58);
        this->isStateSplit = false;
        this->state = this->stateWhenTrue;
        this->stateWhenTrue = 0;
        this->stateWhenFalse = 0;
      }
      ast::Statement::visit<TestAnalysis&>((pIVar6->stmt).ptr,(TestAnalysis *)this);
      iVar5 = iVar5 + this->state;
      pIVar6 = pIVar6 + 1;
    } while (pIVar6 != pIVar1);
  }
  this_01 = stmt->defaultCase;
  if (this_01 != (Statement *)0x0) {
    this->isStateSplit = false;
    this->state = iVar4;
    this->stateWhenTrue = 0;
    this->stateWhenFalse = 0;
    ast::Statement::visit<TestAnalysis&>(this_01,(TestAnalysis *)this);
    iVar4 = this->state;
  }
  this->isStateSplit = false;
  this->state = iVar4 + iVar5;
  this->stateWhenTrue = 0;
  this->stateWhenFalse = 0;
  return;
}

Assistant:

void visitStmt(const PatternCaseStatement& stmt) {
        // TODO: match handling for regular CaseStatements
        visit(stmt.expr);

        auto initialState = std::move(state);
        auto finalState = (DERIVED).unreachableState();

        for (auto& item : stmt.items) {
            setState((DERIVED).copyState(initialState));

            visit(*item.pattern);

            if (item.filter) {
                visitCondition(*item.filter);
                setState(std::move(stateWhenTrue));
            }

            visit(*item.stmt);
            (DERIVED).joinState(finalState, state);
        }

        if (stmt.defaultCase) {
            setState((DERIVED).copyState(initialState));
            visit(*stmt.defaultCase);
            (DERIVED).joinState(finalState, state);
        }
        else {
            (DERIVED).joinState(finalState, initialState);
        }

        setState(std::move(finalState));
    }